

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::RTI_IP(CPU *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  
  this->cycles = 6;
  uVar1 = GetStackByte(this);
  (this->field_6).ps = uVar1;
  uVar2 = GetStackWord(this);
  this->pc = uVar2;
  return;
}

Assistant:

void CPU::RTI_IP()
{
    cycles = 6;
    ps = GetStackByte();
    pc = GetStackWord();
}